

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renderLogMsg(int iErrCode,char *zFormat,__va_list_tag *ap)

{
  _func_void_void_ptr_int_char_ptr *p_Var1;
  void *pvVar2;
  char *pcVar3;
  char local_118 [8];
  char zMsg [210];
  StrAccum acc;
  __va_list_tag *ap_local;
  char *zFormat_local;
  int iErrCode_local;
  
  sqlite3StrAccumInit((StrAccum *)(zMsg + 0xd0),(sqlite3 *)0x0,local_118,0xd2,0);
  sqlite3_str_vappendf((sqlite3_str *)(zMsg + 0xd0),zFormat,ap);
  pvVar2 = sqlite3Config.pLogArg;
  p_Var1 = sqlite3Config.xLog;
  pcVar3 = sqlite3StrAccumFinish((StrAccum *)(zMsg + 0xd0));
  (*p_Var1)(pvVar2,iErrCode,pcVar3);
  return;
}

Assistant:

static void renderLogMsg(int iErrCode, const char *zFormat, va_list ap){
  StrAccum acc;                          /* String accumulator */
  char zMsg[SQLITE_PRINT_BUF_SIZE*3];    /* Complete log message */

  sqlite3StrAccumInit(&acc, 0, zMsg, sizeof(zMsg), 0);
  sqlite3_str_vappendf(&acc, zFormat, ap);
  sqlite3GlobalConfig.xLog(sqlite3GlobalConfig.pLogArg, iErrCode,
                           sqlite3StrAccumFinish(&acc));
}